

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O3

int32_t zng_inflateInit2(zng_stream *strm,int32_t windowBits)

{
  internal_state *piVar1;
  static_tree_desc *psVar2;
  uint32_t uVar3;
  int32_t iVar4;
  code *pcVar5;
  void *pvVar6;
  ulong uVar7;
  
  (*functable.force_init)();
  if (strm == (zng_stream *)0x0) {
    iVar4 = -2;
  }
  else {
    strm->msg = (char *)0x0;
    pcVar5 = strm->zalloc;
    if (pcVar5 == (alloc_func)0x0) {
      pcVar5 = zng_zcalloc;
      strm->zalloc = zng_zcalloc;
      strm->opaque = (void *)0x0;
    }
    if (strm->zfree == (free_func)0x0) {
      strm->zfree = zng_zcfree;
    }
    pvVar6 = (*pcVar5)(strm->opaque,1,0xa4c0);
    if (pvVar6 == (void *)0x0) {
      iVar4 = -4;
    }
    else {
      uVar7 = (ulong)(-(int)pvVar6 & 0x3f);
      *(void **)((long)pvVar6 + uVar7 + 0xa440) = pvVar6;
      *(free_func *)((long)pvVar6 + uVar7 + 0xa448) = strm->zfree;
      *(ulong *)((long)pvVar6 + uVar7 + 0xa458) = (long)pvVar6 + uVar7;
      piVar1 = (internal_state *)((long)pvVar6 + uVar7 + 0x8040);
      *(internal_state **)((long)pvVar6 + uVar7 + 0xa450) = piVar1;
      *(ulong *)((long)pvVar6 + uVar7 + 0x8090) = (long)pvVar6 + uVar7;
      *(ulong *)((long)pvVar6 + uVar7 + 0xa408) = (long)pvVar6 + uVar7 + 0xa440;
      *(undefined4 *)((long)pvVar6 + uVar7 + 0x8084) = 0x8040;
      strm->state = piVar1;
      *(zng_stream **)((long)pvVar6 + uVar7 + 0x8040) = strm;
      *(undefined4 *)((long)pvVar6 + uVar7 + 0x8048) = 0x3f34;
      uVar3 = (*functable.chunksize)();
      *(uint32_t *)((long)pvVar6 + uVar7 + 0x8098) = uVar3;
      iVar4 = zng_inflateReset2(strm,windowBits);
      if (iVar4 == 0) {
        iVar4 = 0;
      }
      else {
        psVar2 = strm->state[1].bl_desc.stat_desc;
        if (psVar2 != (static_tree_desc *)0x0) {
          (*(code *)psVar2->extra_bits)(strm->opaque,psVar2->static_tree);
          strm->state = (internal_state *)0x0;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

PREFIX(inflateInit2)(PREFIX3(stream) *strm, int32_t windowBits) {
    struct inflate_state *state;
    int32_t ret;

    /* Initialize functable */
    FUNCTABLE_INIT;

    if (strm == NULL)
        return Z_STREAM_ERROR;
    strm->msg = NULL;                   /* in case we return an error */
    if (strm->zalloc == NULL) {
        strm->zalloc = PREFIX(zcalloc);
        strm->opaque = NULL;
    }
    if (strm->zfree == NULL)
        strm->zfree = PREFIX(zcfree);

    inflate_allocs *alloc_bufs = alloc_inflate(strm);
    if (alloc_bufs == NULL)
        return Z_MEM_ERROR;

    state = alloc_bufs->state;
    state->window = alloc_bufs->window;
    state->alloc_bufs = alloc_bufs;
    state->wbufsize = INFLATE_ADJUST_WINDOW_SIZE((1 << MAX_WBITS) + 64);
    Tracev((stderr, "inflate: allocated\n"));

    strm->state = (struct internal_state *)state;
    state->strm = strm;
    state->mode = HEAD;     /* to pass state test in inflateReset2() */
    state->chunksize = FUNCTABLE_CALL(chunksize)();
    ret = PREFIX(inflateReset2)(strm, windowBits);
    if (ret != Z_OK) {
        free_inflate(strm);
    }
    return ret;
}